

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O2

void CheckLine(cmMakefile *mf,string *prefix,
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *variablesToRead,char *line)

{
  bool bVar1;
  const_iterator cVar2;
  string_view value_00;
  CacheEntryType type;
  string var;
  string value;
  allocator<char> local_85;
  CacheEntryType local_84;
  string local_80;
  string local_60;
  string local_40;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_40.field_2._M_local_buf[0] = '\0';
  local_84 = UNINITIALIZED;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,line,&local_85);
  bVar1 = cmake::ParseCacheEntry(&local_60,&local_80,&local_40,&local_84);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&variablesToRead->_M_t,&local_80);
    if ((_Rb_tree_header *)cVar2._M_node != &(variablesToRead->_M_t)._M_impl.super__Rb_tree_header)
    {
      std::operator+(&local_60,prefix,&local_80);
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      if (local_40._M_string_length == 0) {
        cmMakefile::RemoveDefinition(mf,&local_80);
      }
      else {
        value_00._M_str = local_40._M_dataplus._M_p;
        value_00._M_len = local_40._M_string_length;
        cmMakefile::AddDefinition(mf,&local_80,value_00);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

static void CheckLine(cmMakefile& mf, std::string const& prefix,
                      std::set<std::string> const& variablesToRead,
                      const char* line)
{
  // Check one line of the cache file.
  std::string var;
  std::string value;
  cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
  if (cmake::ParseCacheEntry(line, var, value, type)) {
    // Found a real entry.  See if this one was requested.
    if (variablesToRead.find(var) != variablesToRead.end()) {
      // This was requested.  Set this variable locally with the given
      // prefix.
      var = prefix + var;
      if (!value.empty()) {
        mf.AddDefinition(var, value);
      } else {
        mf.RemoveDefinition(var);
      }
    }
  }
}